

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STBitString.h
# Opt level: O2

bool __thiscall jbcoin::STBitString<128UL>::isEquivalent(STBitString<128UL> *this,STBase *t)

{
  bool bVar1;
  
  if (t->_vptr_STBase != (_func_int **)&PTR__STBase_002f9590) {
    return false;
  }
  bVar1 = jbcoin::operator==(&this->value_,(base_uint<128UL,_void> *)(t + 1));
  return bVar1;
}

Assistant:

bool
    isEquivalent (const STBase& t) const override
    {
        const STBitString* v = dynamic_cast<const STBitString*> (&t);
        return v && (value_ == v->value_);
    }